

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CudaBackend.cpp
# Opt level: O2

bool __thiscall xmrig::CudaBackend::isEnabled(CudaBackend *this,Algorithm *algorithm)

{
  Config *this_00;
  CudaConfig *pCVar1;
  CudaThreads *pCVar2;
  
  this_00 = Base::config(&this->d_ptr->controller->super_Base);
  pCVar1 = Config::cuda(this_00);
  pCVar2 = Threads<xmrig::CudaThreads>::get(&pCVar1->m_threads);
  return (pCVar2->m_data).super__Vector_base<xmrig::CudaThread,_std::allocator<xmrig::CudaThread>_>.
         _M_impl.super__Vector_impl_data._M_start !=
         (pCVar2->m_data).super__Vector_base<xmrig::CudaThread,_std::allocator<xmrig::CudaThread>_>.
         _M_impl.super__Vector_impl_data._M_finish;
}

Assistant:

bool xmrig::CudaBackend::isEnabled(const Algorithm &algorithm) const
{
    return !d_ptr->controller->config()->cuda().threads().get().isEmpty();
}